

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableStringFieldLiteGenerator::
GenerateSerializationCode(RepeatedImmutableStringFieldLiteGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "for (int i = 0; i < $name$_.size(); i++) {\n  output.writeString($number$, $name$_.get(i));\n}\n"
                    );
  return;
}

Assistant:

void RepeatedImmutableStringFieldLiteGenerator::
GenerateSerializationCode(io::Printer* printer) const {
  // Lite runtime should reduce allocations by serializing the string directly.
  // This avoids spurious intermediary ByteString allocations, cutting overall
  // allocations in half.
  printer->Print(variables_,
    "for (int i = 0; i < $name$_.size(); i++) {\n"
    "  output.writeString($number$, $name$_.get(i));\n"
    "}\n");
}